

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_has_mouse_click_in_rect(nk_input *i,nk_buttons id,nk_rect b)

{
  nk_mouse_button *btn;
  nk_buttons id_local;
  nk_input *i_local;
  nk_rect b_local;
  nk_bool local_4;
  
  if (i == (nk_input *)0x0) {
    local_4 = 0;
  }
  else {
    b_local.x = b.x;
    if (((((i->mouse).buttons[id].clicked_pos.x < b_local.x) ||
         (b_local.w = b.w, b_local.x + b_local.w <= (i->mouse).buttons[id].clicked_pos.x)) ||
        (b_local.y = b.y, (i->mouse).buttons[id].clicked_pos.y < b_local.y)) ||
       (b_local.h = b.h, b_local.y + b_local.h <= (i->mouse).buttons[id].clicked_pos.y)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_input_has_mouse_click_in_rect(const struct nk_input *i, enum nk_buttons id,
struct nk_rect b)
{
const struct nk_mouse_button *btn;
if (!i) return nk_false;
btn = &i->mouse.buttons[id];
if (!NK_INBOX(btn->clicked_pos.x,btn->clicked_pos.y,b.x,b.y,b.w,b.h))
return nk_false;
return nk_true;
}